

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::Pipeline::_InternalParse(Pipeline *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  internal *this_00;
  size_t size;
  bool bVar3;
  Model *obj;
  MessageLite *msg;
  string *s;
  Rep *pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  byte *pbVar6;
  uint res;
  pair<const_char_*,_unsigned_int> pVar7;
  StringPiece str;
  byte *local_40;
  InternalMetadata *local_38;
  
  local_40 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar3) {
    local_38 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_40;
      res = (uint)bVar1;
      pbVar6 = local_40 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
        if ((char)*pbVar6 < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
          pbVar6 = (byte *)pVar7.first;
          res = pVar7.second;
        }
        else {
          pbVar6 = local_40 + 2;
        }
      }
      if (res >> 3 == 2) {
        if ((char)res != '\x12') goto LAB_00221742;
        local_40 = pbVar6 + -1;
        do {
          local_40 = local_40 + 1;
          pRVar4 = (this->names_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002216c3:
            pbVar5 = google::protobuf::Arena::Create<std::__cxx11::string>
                               ((this->names_).super_RepeatedPtrFieldBase.arena_);
            s = (string *)
                google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                          (&(this->names_).super_RepeatedPtrFieldBase,pbVar5);
          }
          else {
            iVar2 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar2) goto LAB_002216c3;
            (this->names_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            s = (string *)pRVar4->elements[iVar2];
          }
          local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (s,(char *)local_40,ctx);
          this_00 = (internal *)(s->_M_dataplus)._M_p;
          size = s->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar3 = google::protobuf::internal::VerifyUTF8(this_00,str,(char *)pRVar4);
          if (!bVar3) {
            return (char *)0x0;
          }
          if (local_40 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == 0x12));
      }
      else if ((res >> 3 == 1) && ((char)res == '\n')) {
        local_40 = pbVar6 + -1;
        do {
          local_40 = local_40 + 1;
          pRVar4 = (this->models_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_00221647:
            obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Model>
                            ((this->models_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->models_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->models_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar2) goto LAB_00221647;
            (this->models_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar4->elements[iVar2];
          }
          local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,msg,(char *)local_40);
          if (local_40 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == 10));
      }
      else {
LAB_00221742:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar6 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar6;
        }
        local_40 = pbVar6;
        if ((local_38->ptr_ & 1U) == 0) {
          pbVar5 = google::protobuf::internal::InternalMetadata::
                   mutable_unknown_fields_slow<std::__cxx11::string>(local_38);
        }
        else {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((local_38->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,pbVar5,(char *)local_40,ctx);
        if (local_40 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_40;
}

Assistant:

const char* Pipeline::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.Model models = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_models(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated string names = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_names();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}